

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderView::updateSection(QHeaderView *this,int logicalIndex)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int awidth;
  QHeaderViewPrivate *pQVar4;
  undefined4 in_ESI;
  QHeaderView *in_RDI;
  long in_FS_OFFSET;
  QHeaderViewPrivate *d;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  QRect *in_stack_ffffffffffffffa0;
  QWidget *rect;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QHeaderView *)0x8365ce);
  iVar2 = (int)((ulong)pQVar4 >> 0x20);
  if (pQVar4->orientation == Horizontal) {
    iVar3 = (int)((ulong)(pQVar4->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                         viewport >> 0x20);
    iVar2 = sectionViewportPosition((QHeaderView *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),iVar2)
    ;
    iVar3 = sectionSize(in_RDI,iVar3);
    QWidget::height((QWidget *)0x836627);
    QRect::QRect((QRect *)CONCAT44(iVar3,iVar2),(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                 (int)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
    ;
    QWidget::update((QWidget *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffa0);
  }
  else {
    rect = (pQVar4->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
    iVar2 = sectionViewportPosition((QHeaderView *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),iVar2)
    ;
    awidth = QWidget::width((QWidget *)0x836682);
    sectionSize(in_RDI,iVar3);
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 (int)((ulong)rect >> 0x20),(int)rect,awidth,iVar2);
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (QRect *)rect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderView::updateSection(int logicalIndex)
{
    Q_D(QHeaderView);
    if (d->orientation == Qt::Horizontal)
        d->viewport->update(QRect(sectionViewportPosition(logicalIndex),
                                  0, sectionSize(logicalIndex), d->viewport->height()));
    else
        d->viewport->update(QRect(0, sectionViewportPosition(logicalIndex),
                                  d->viewport->width(), sectionSize(logicalIndex)));
}